

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_convert_instruction_target(dmr_C *C,instruction *insn,pseudo_t src)

{
  pseudo_t ppVar1;
  pseudo_t ppVar2;
  void *pvVar3;
  undefined1 local_48 [8];
  ptr_list_iter puiter__;
  
  ppVar1 = (insn->field_5).target;
  if (ppVar1 != src) {
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)ppVar1->users);
    pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_48);
    while (pvVar3 != (void *)0x0) {
      ppVar2 = (pseudo_t)**(long **)((long)pvVar3 + 8);
      if (ppVar2 != &C->L->void_pseudo) {
        if (ppVar2 != ppVar1) {
          __assert_fail("*pu->userp == target",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                        ,0x9d9,
                        "void dmrC_convert_instruction_target(struct dmr_C *, struct instruction *, pseudo_t)"
                       );
        }
        **(long **)((long)pvVar3 + 8) = (long)src;
      }
      pvVar3 = ptrlist_iter_next((ptr_list_iter *)local_48);
    }
    if (((src != (pseudo_t)0x0) && (src->type != PSEUDO_VOID)) && (src->type != PSEUDO_VAL)) {
      ptrlist_concat((ptr_list *)ppVar1->users,(ptr_list **)&src->users);
    }
    ppVar1->users = (pseudo_user_list *)0x0;
  }
  return;
}

Assistant:

void dmrC_convert_instruction_target(struct dmr_C *C, struct instruction *insn, pseudo_t src)
{
	pseudo_t target;
	struct pseudo_user *pu;
	/*
	 * Go through the "insn->users" list and replace them all..
	 */
	target = insn->target;
	if (target == src)
		return;
	FOR_EACH_PTR(target->users, pu) {
		if (*pu->userp != VOID_PSEUDO(C)) {
			assert(*pu->userp == target);
			*pu->userp = src;
		}
	} END_FOR_EACH_PTR(pu);
	if (dmrC_has_use_list(src))
		concat_user_list(target->users, &src->users);
	target->users = NULL;
}